

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O2

Atom_t __thiscall Potassco::ProgramReader::matchAtom(ProgramReader *this,char *err)

{
  Atom_t AVar1;
  BufferedStream *str;
  
  str = stream(this);
  AVar1 = Potassco::matchAtom(str,this->varMax_,err);
  return AVar1;
}

Assistant:

Atom_t   matchAtom(const char* err = "atom expected") { return Potassco::matchAtom(*stream(), varMax_, err); }